

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVAfindIndex(CVodeMem cv_mem,sunrealtype t,long *indx,int *newpoint)

{
  CVadjMemRec *pCVar1;
  CVdtpntMemRec **ppCVar2;
  int iVar3;
  int to_right;
  int to_left;
  int sign;
  CVdtpntMem *dt_mem;
  CVadjMem ca_mem;
  int *newpoint_local;
  long *indx_local;
  sunrealtype t_local;
  CVodeMem cv_mem_local;
  
  pCVar1 = cv_mem->cv_adj_mem;
  ppCVar2 = pCVar1->dt_mem;
  *newpoint = 0;
  iVar3 = -1;
  if (0.0 < pCVar1->ca_tfinal - pCVar1->ca_tinitial) {
    iVar3 = 1;
  }
  if (pCVar1->ca_IMnewData != 0) {
    pCVar1->ca_ilast = pCVar1->ca_np + -1;
    *newpoint = 1;
    pCVar1->ca_IMnewData = 0;
  }
  if (0.0 <= (double)iVar3 * (t - ppCVar2[pCVar1->ca_ilast + -1]->t)) {
    if ((double)iVar3 * (t - ppCVar2[pCVar1->ca_ilast]->t) <= 0.0) {
      *indx = pCVar1->ca_ilast;
    }
    else {
      *newpoint = 1;
      *indx = pCVar1->ca_ilast;
      while (0.0 < (double)iVar3 * (t - ppCVar2[*indx]->t)) {
        *indx = *indx + 1;
      }
      pCVar1->ca_ilast = *indx;
    }
  }
  else {
    *newpoint = 1;
    *indx = pCVar1->ca_ilast;
    while ((*indx != 0 && ((double)iVar3 * (t - ppCVar2[*indx + -1]->t) <= 0.0))) {
      *indx = *indx + -1;
    }
    if (*indx == 0) {
      pCVar1->ca_ilast = 1;
    }
    else {
      pCVar1->ca_ilast = *indx;
    }
    if ((*indx == 0) && (cv_mem->cv_uround * 1000000.0 < ABS(t - (*ppCVar2)->t))) {
      return -0x6b;
    }
  }
  return 0;
}

Assistant:

static int CVAfindIndex(CVodeMem cv_mem, sunrealtype t, long int* indx,
                        sunbooleantype* newpoint)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  int sign;
  sunbooleantype to_left, to_right;

  ca_mem = cv_mem->cv_adj_mem;
  dt_mem = ca_mem->dt_mem;

  *newpoint = SUNFALSE;

  /* Find the direction of integration */
  sign = (ca_mem->ca_tfinal - ca_mem->ca_tinitial > ZERO) ? 1 : -1;

  /* If this is the first time we use new data */
  if (ca_mem->ca_IMnewData)
  {
    ca_mem->ca_ilast     = ca_mem->ca_np - 1;
    *newpoint            = SUNTRUE;
    ca_mem->ca_IMnewData = SUNFALSE;
  }

  /* Search for indx starting from ilast */
  to_left  = (sign * (t - dt_mem[ca_mem->ca_ilast - 1]->t) < ZERO);
  to_right = (sign * (t - dt_mem[ca_mem->ca_ilast]->t) > ZERO);

  if (to_left)
  {
    /* look for a new indx to the left */

    *newpoint = SUNTRUE;

    *indx = ca_mem->ca_ilast;
    for (;;)
    {
      if (*indx == 0) { break; }
      if (sign * (t - dt_mem[*indx - 1]->t) <= ZERO) { (*indx)--; }
      else { break; }
    }

    if (*indx == 0) { ca_mem->ca_ilast = 1; }
    else { ca_mem->ca_ilast = *indx; }

    if (*indx == 0)
    {
      /* t is beyond leftmost limit. Is it too far? */
      if (SUNRabs(t - dt_mem[0]->t) > FUZZ_FACTOR * cv_mem->cv_uround)
      {
        return (CV_GETY_BADT);
      }
    }
  }
  else if (to_right)
  {
    /* look for a new indx to the right */

    *newpoint = SUNTRUE;

    *indx = ca_mem->ca_ilast;
    for (;;)
    {
      if (sign * (t - dt_mem[*indx]->t) > ZERO) { (*indx)++; }
      else { break; }
    }

    ca_mem->ca_ilast = *indx;
  }
  else
  {
    /* ilast is still OK */

    *indx = ca_mem->ca_ilast;
  }

  return (CV_SUCCESS);
}